

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_skip(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint __fd;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *__buf;
  char *__n;
  void *pvVar7;
  void *__s2;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  DIR *__dirp;
  dirent *pdVar12;
  FILE *__stream;
  long lVar13;
  undefined8 uVar14;
  uint extraout_EDX;
  ulong uVar15;
  char *__dest;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *pDVar19;
  DIR *__filename;
  undefined8 uVar20;
  DIR *pDVar21;
  char *pcVar22;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6d98 [8];
  undefined1 auStack_6d90 [504];
  ulong uStack_6b98;
  DIR *pDStack_6b90;
  char *pcStack_6b88;
  DIR *pDStack_6b80;
  DIR *pDStack_6b78;
  int iStack_6b6c;
  DIR *pDStack_6b68;
  stat sStack_6b60;
  char acStack_6ad0 [512];
  size_t sStack_68d0;
  char *pcStack_68c8;
  DIR *pDStack_68c0;
  char *pcStack_68b8;
  code *pcStack_68b0;
  char *pcStack_68a8;
  ulong uStack_68a0;
  char *pcStack_6898;
  DIR *pDStack_6890;
  undefined8 *puStack_6888;
  undefined8 uStack_6850;
  undefined1 *puStack_6848;
  undefined1 *puStack_6840;
  undefined1 auStack_6830 [8];
  char *pcStack_6828;
  undefined8 uStack_6818;
  char *pcStack_6810;
  undefined8 uStack_6808;
  undefined8 uStack_67f0;
  DIR aDStack_6780 [25944];
  char *pcStack_228;
  char *pcStack_220;
  char *pcStack_218;
  char *pcStack_210;
  code *apcStack_208 [2];
  undefined1 auStack_1f8 [116];
  uint uStack_184;
  char acStack_180 [256];
  undefined8 uStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  code *apcStack_40 [2];
  
  apcStack_40[0] = (code *)0x13c79f;
  pcStack_68 = (char *)bson_bcon_magic();
  uStack_48 = 0;
  pcStack_50 = "}";
  pcStack_58 = (char *)0xa;
  pcStack_60 = (char *)0xf;
  pcStack_70 = (char *)0x13c7f2;
  uVar5 = bcon_new(0,"hello","world","foo","{","bar");
  apcStack_40[0] = (code *)0x13c7fe;
  pcVar6 = (char *)bson_bcone_magic();
  pcVar22 = "}";
  uStack_48 = 0;
  pcStack_50 = "}";
  pcStack_58 = (char *)0x10;
  pcStack_60 = (char *)0x1c;
  pcStack_70 = "bar";
  pcStack_78 = "{";
  uStack_80 = 0x13c83a;
  pcStack_68 = pcVar6;
  cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
  if (cVar1 == '\0') {
    apcStack_40[0] = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_48 = 0;
    pcStack_50 = "}";
    pcStack_58 = (char *)0x12;
    pcStack_60 = (char *)0x1c;
    pcStack_70 = "bar";
    pcStack_78 = "{";
    uStack_80 = 0x13c879;
    pcStack_68 = pcVar6;
    cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar5);
      return;
    }
  }
  apcStack_40[0] = test_iter;
  test_skip_cold_2();
  apcStack_40[0] = (code *)0x14c89e;
  pcStack_50 = "bar";
  pcStack_58 = "}";
  pcStack_68 = "{";
  apcStack_208[0] = (code *)0x13c8be;
  pcStack_60 = pcVar6;
  uStack_48 = uVar5;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_208[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_208[0] = (code *)0x13c8ed;
  uVar5 = bson_bcone_magic();
  pcVar8 = acStack_180;
  pcVar16 = "foo";
  uVar14 = 0x1d;
  uVar20 = 0;
  apcStack_208[0] = (code *)0x13c90d;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar5);
  uVar5 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_208[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_208[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_208[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_208[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_208[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar18 = acStack_180;
    apcStack_208[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar5 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar18 = acStack_180;
    apcStack_208[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar5 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar20 = 0;
    apcStack_208[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_180);
    apcStack_208[0] = (code *)0x13c96f;
    pcVar6 = (char *)bson_get_data(__n_00);
    apcStack_208[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_208[0] = (code *)0x13c98e;
      pvVar7 = (void *)bson_get_data(__n);
      apcStack_208[0] = (code *)0x13c999;
      __s2 = (void *)bson_get_data(__n_00);
      apcStack_208[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar7,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_208[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_208[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_208[0] = (code *)0x13c9d4;
    uVar14 = bson_as_canonical_extended_json(__n_00);
    apcStack_208[0] = (code *)0x13c9e1;
    pcVar8 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar15 = 0xffffffff;
    if (uVar3 != 0) {
      uVar17 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar17) break;
        if (pcVar6[uVar17] != __buf[uVar17]) {
          uVar15 = uVar17 & 0xffffffff;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (uVar3 != (uint)uVar17);
    }
    if ((int)uVar15 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar15 = (ulong)(uVar3 - 1);
    }
    apcStack_208[0] = (code *)0x13ca3c;
    uVar5 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar15);
    apcStack_208[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar22 = (char *)(ulong)uVar3;
    pcVar18 = "failure.expected.bson";
    pcVar16 = (char *)0x42;
    apcStack_208[0] = (code *)0x13ca6f;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    uStack_184 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (__fd == 0xffffffff) goto LAB_0013cad0;
    pcVar22 = (char *)(ulong)__fd;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar18 = (char *)(ulong)uVar3;
    apcStack_208[0] = (code *)0x13ca95;
    pcVar16 = pcVar6;
    pcVar9 = (char *)write(uVar3,pcVar6,(size_t)__n_00);
    if (pcVar9 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_208[0] = (code *)0x13caab;
      pcVar16 = __buf;
      pcVar18 = pcVar22;
      pcVar9 = (char *)write(__fd,__buf,(size_t)__n);
      if (pcVar9 != __n) goto LAB_0013cada;
      pcVar18 = (char *)(ulong)uStack_184;
      pcVar16 = (char *)(ulong)__fd;
      apcStack_208[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_208[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_208[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6840 = auStack_6830;
  if (extraout_AL != '\0') {
    uStack_67f0 = uVar5;
  }
  puStack_6888 = (undefined8 *)0x13cb62;
  pcStack_6828 = pcVar16;
  uStack_6818 = uVar14;
  pcStack_6810 = pcVar8;
  uStack_6808 = uVar20;
  pcStack_228 = __n;
  pcStack_220 = pcVar6;
  pcStack_218 = __buf;
  pcStack_210 = __n_00;
  apcStack_208[0] = (code *)apcStack_40;
  bcon_extract_ctx_init(aDStack_6780);
  puStack_6848 = auStack_1f8;
  uStack_6850 = 0x3000000010;
  uVar5 = 0x10;
  if (0 < (int)(uint)pcStack_6828) {
    uVar3 = (uint)pcStack_6828;
    do {
      puStack_6888 = (undefined8 *)0x13cbce;
      __s = aDStack_6780;
      pcVar6 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6780,&uStack_6850);
      iVar2 = (int)uVar5;
      if (cVar1 == '\0') {
        puStack_6888 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_68b0 = (code *)0x13cc03;
        __name = __s;
        pcStack_68a8 = pcVar18;
        uStack_68a0 = (ulong)uVar3;
        pcStack_6898 = pcVar22;
        pDStack_6890 = aDStack_6780;
        puStack_6888 = &uStack_6850;
        pcVar22 = (char *)strlen(pcVar6);
        pcStack_68b0 = (code *)0x13cc0e;
        pDVar19 = __s;
        sVar10 = strlen((char *)__s);
        if ((int)sVar10 + (int)pcVar22 < 499) {
          pcStack_68b0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_68b0 = (code *)0x13cc38;
          strncat(__dest,pcVar6,(long)(int)pcVar22);
          pcStack_68b0 = (code *)0x13cc40;
          sVar11 = strlen(__dest);
          (__dest + sVar11)[0] = '/';
          (__dest + sVar11)[1] = '\0';
          pcStack_68b0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar10);
          pcVar6 = __dest;
          do {
            if (*pcVar6 == '\\') {
              *pcVar6 = '/';
            }
            else if (*pcVar6 == '\0') {
              return;
            }
            pcVar6 = pcVar6 + 1;
          } while( true );
        }
        pcStack_68b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar15 = (ulong)extraout_EDX;
        pDStack_6b78 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_6b6c = iVar2;
        sStack_68d0 = sVar10;
        pcStack_68c8 = pcVar22;
        pDStack_68c0 = __s;
        pcStack_68b8 = pcVar6;
        pcStack_68b0 = (code *)apcStack_208;
        __dirp = opendir((char *)__name);
        pDVar21 = pDVar19;
        pDStack_6b80 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_6b78 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar12 = readdir(__dirp);
        if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar22 = "..";
        pDVar21 = (DIR *)0x147699;
        pDStack_6b68 = pDVar19;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_6b78 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar6,acStack_6ad0);
  pDStack_6b78 = (DIR *)0x13cd32;
  iVar4 = stat(pcVar6,&sStack_6b60);
  if ((iVar4 == 0) && ((sStack_6b60.st_mode & 0xf000) == 0x4000)) {
    pDStack_6b78 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_6b68,acStack_6ad0,iVar2,iStack_6b6c);
    uVar15 = (ulong)uVar3;
  }
  else {
    pDStack_6b78 = (DIR *)0x13cd73;
    pcVar8 = strstr(pcVar6,".json");
    if (pcVar8 != (char *)0x0) {
      uVar15 = (ulong)(iVar2 + 1);
      pDStack_6b78 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar6,(char *)(pDStack_6b68 + (long)iVar2 * 500));
    }
  }
  pDStack_6b78 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar12 = readdir(__dirp);
  if (pdVar12 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_6b78 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar15;
  if (iVar2 < iStack_6b6c) {
    do {
      pcVar6 = pdVar12->d_name;
      pDStack_6b78 = (DIR *)0x13ccea;
      iVar4 = strcmp(pcVar6,"..");
      if (iVar4 != 0) {
        pDStack_6b78 = (DIR *)0x13ccf9;
        iVar4 = strcmp(pcVar6,".");
        if (iVar4 != 0) goto LAB_0013cd12;
      }
      pDStack_6b78 = (DIR *)0x13cd05;
      pdVar12 = readdir(__dirp);
      if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_6b78 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_6b80 = __dirp;
LAB_0013cdc9:
  pDStack_6b78 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_6b98 = uVar15;
  pDStack_6b90 = pDVar21;
  pcStack_6b88 = pcVar22;
  pDStack_6b78 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar10 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar10) {
      pvVar7 = (void *)bson_malloc0(sVar10);
      sVar11 = fread(pvVar7,1,sVar10,__stream);
      if (sVar11 != sVar10) {
        abort();
      }
      fclose(__stream);
      if (pvVar7 != (void *)0x0) {
        lVar13 = bson_new_from_json(pvVar7,sVar10,auStack_6d98);
        if (lVar13 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6d90);
          abort();
        }
        bson_free(pvVar7);
      }
    }
  }
  return;
}

Assistant:

static void
test_skip (void)
{
   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_SKIP (BSON_TYPE_UTF8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_SKIP (BSON_TYPE_INT32),
                         "}"));

   BSON_ASSERT (!BCON_EXTRACT (bcon,
                          "hello",
                          BCONE_SKIP (BSON_TYPE_UTF8),
                          "foo",
                          "{",
                          "bar",
                          BCONE_SKIP (BSON_TYPE_INT64),
                          "}"));

   bson_destroy (bcon);
}